

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.cpp
# Opt level: O0

void uprv_free_63(void *buffer)

{
  void *buffer_local;
  
  if ((int32_t *)buffer != zeroMem) {
    if (pFree == (UMemFreeFn *)0x0) {
      free(buffer);
    }
    else {
      (*pFree)(pContext,buffer);
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uprv_free(void *buffer) {
#if U_DEBUG && defined(UPRV_MALLOC_COUNT)
  putchar('<');
  fflush(stdout);
#endif
    if (buffer != zeroMem) {
        if (pFree) {
            (*pFree)(pContext, buffer);
        } else {
            uprv_default_free(buffer);
        }
    }
}